

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

void __thiscall FStringTable::LoadStrings(FStringTable *this,bool enuOnly)

{
  int lumpnum;
  int local_24;
  int local_20;
  int j;
  int i;
  int lump;
  int lastlump;
  bool enuOnly_local;
  FStringTable *this_local;
  
  lump._3_1_ = enuOnly;
  _lastlump = this;
  FreeNonDehackedStrings(this);
  i = 0;
  while (lumpnum = FWadCollection::FindLump(&Wads,"LANGUAGE",&i,false), lumpnum != -1) {
    local_24 = 0;
    if ((lump._3_1_ & 1) == 0) {
      local_24 = 1;
      LoadLanguage(this,lumpnum,0x2a,true,1);
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        LoadLanguage(this,lumpnum,LanguageIDs[local_20],true,local_24 + 1);
        LoadLanguage(this,lumpnum,LanguageIDs[local_20] & 0xffff,true,local_24 + 2);
        local_24 = local_24 + 3;
        LoadLanguage(this,lumpnum,LanguageIDs[local_20],false,local_24);
      }
    }
    LoadLanguage(this,lumpnum,0x2a2a,true,local_24 + 1);
  }
  return;
}

Assistant:

void FStringTable::LoadStrings (bool enuOnly)
{
	int lastlump, lump;
	int i, j;

	FreeNonDehackedStrings ();

	lastlump = 0;

	while ((lump = Wads.FindLump ("LANGUAGE", &lastlump)) != -1)
	{
		j = 0;
		if (!enuOnly)
		{
			LoadLanguage (lump, MAKE_ID('*',0,0,0), true, ++j);
			for (i = 0; i < 4; ++i)
			{
				LoadLanguage (lump, LanguageIDs[i], true, ++j);
				LoadLanguage (lump, LanguageIDs[i] & MAKE_ID(0xff,0xff,0,0), true, ++j);
				LoadLanguage (lump, LanguageIDs[i], false, ++j);
			}
		}

		// Fill in any missing strings with the default language
		LoadLanguage (lump, MAKE_ID('*','*',0,0), true, ++j);
	}
}